

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O1

REF_STATUS ref_oct_bbox_overlap(REF_DBL *bbox0,REF_DBL *bbox1,REF_BOOL *overlap)

{
  *overlap = 0;
  if ((((*bbox1 < bbox0[1] || *bbox1 == bbox0[1]) && (*bbox0 < bbox1[1] || *bbox0 == bbox1[1])) &&
      (bbox1[2] < bbox0[3] || bbox1[2] == bbox0[3])) &&
     (((bbox0[2] < bbox1[3] || bbox0[2] == bbox1[3] && (bbox1[4] < bbox0[5] || bbox1[4] == bbox0[5])
       ) && (bbox0[4] < bbox1[5] || bbox0[4] == bbox1[5])))) {
    *overlap = 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_oct_bbox_overlap(REF_DBL *bbox0, REF_DBL *bbox1,
                                        REF_BOOL *overlap) {
  *overlap = REF_FALSE;
  if (bbox0[1] < bbox1[0] || bbox1[1] < bbox0[0]) return REF_SUCCESS;
  if (bbox0[3] < bbox1[2] || bbox1[3] < bbox0[2]) return REF_SUCCESS;
  if (bbox0[5] < bbox1[4] || bbox1[5] < bbox0[4]) return REF_SUCCESS;
  *overlap = REF_TRUE;
  return REF_SUCCESS;
}